

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ssi.cpp
# Opt level: O3

void __thiscall pg::SSISolver::run(SSISolver *this)

{
  bitset *this_00;
  bitset *this_01;
  bitset *this_02;
  ulong *puVar1;
  uint64_t *puVar2;
  uint64_t *puVar3;
  int iVar4;
  int iVar5;
  ulong uVar6;
  uint *puVar7;
  int *piVar8;
  ostream *poVar9;
  Game *pGVar10;
  size_t sVar11;
  Error *this_03;
  ulong uVar12;
  long lVar13;
  int u;
  int iVar14;
  size_t sVar15;
  ulong uVar16;
  int iVar17;
  _label_vertex local_50;
  _label_vertex local_40;
  
  this_00 = &this->G;
  bitset::operator=(this_00,(this->super_Solver).disabled);
  if ((this->G)._bitssize == 0) {
    uVar6 = 0;
  }
  else {
    puVar2 = this_00->_bits;
    uVar12 = 0;
    do {
      puVar2[uVar12] = ~puVar2[uVar12];
      uVar12 = uVar12 + 1;
      uVar6 = (this->G)._bitssize;
    } while (uVar12 < uVar6);
  }
  puVar2 = (this->G)._bits;
  uVar12 = (this->G)._size & 0x3f;
  if (uVar12 != 0) {
    puVar2[uVar6 - 1] = puVar2[uVar6 - 1] & ~(-1L << uVar12);
    uVar6 = (this->G)._bitssize;
  }
  uVar12 = 0;
  do {
    if (uVar6 == uVar12) {
      return;
    }
    puVar3 = puVar2 + uVar12;
    uVar12 = uVar12 + 1;
  } while (*puVar3 == 0);
  lVar13 = -(uVar6 << 0x26);
  do {
    lVar13 = lVar13 + 0x4000000000;
    if (puVar2[uVar6 - 1] != 0) {
      uVar6 = (LZCOUNT(puVar2[uVar6 - 1]) << 0x20) - lVar13 >> 0x20 ^ 0x3f;
      goto LAB_00166c71;
    }
    uVar6 = uVar6 - 1;
  } while (uVar6 != 0);
  uVar6 = 0xffffffffffffffff;
LAB_00166c71:
  pGVar10 = (this->super_Solver).game;
  puVar7 = (this->Q).queue;
  this->k = pGVar10->_priority[uVar6] + 1;
  uVar6 = pGVar10->n_vertices;
  (this->Q).pointer = 0;
  if (puVar7 != (uint *)0x0) {
    operator_delete__(puVar7);
    pGVar10 = (this->super_Solver).game;
  }
  puVar7 = (uint *)operator_new__((uVar6 & 0xffffffff) << 2);
  (this->Q).queue = puVar7;
  bitset::resize(&this->C,pGVar10->n_vertices);
  bitset::resize(&this->V,((this->super_Solver).game)->n_vertices);
  this_01 = &this->W0;
  bitset::resize(this_01,((this->super_Solver).game)->n_vertices);
  this_02 = &this->W1;
  bitset::resize(this_02,((this->super_Solver).game)->n_vertices);
  bitset::resize(&this->halt0,((this->super_Solver).game)->n_vertices);
  bitset::resize(&this->halt1,((this->super_Solver).game)->n_vertices);
  bitset::resize(&this->V0,((this->super_Solver).game)->n_vertices);
  bitset::resize(&this->V1,((this->super_Solver).game)->n_vertices);
  pGVar10 = (this->super_Solver).game;
  uVar6 = (long)this->k * pGVar10->n_vertices;
  piVar8 = (int *)operator_new__(-(ulong)(uVar6 >> 0x3e != 0) | uVar6 * 4);
  this->val = piVar8;
  piVar8 = (int *)operator_new__(-(ulong)((ulong)pGVar10->n_vertices >> 0x3e != 0) |
                                 pGVar10->n_vertices << 2);
  this->str0 = piVar8;
  piVar8 = (int *)operator_new__(-(ulong)((ulong)pGVar10->n_vertices >> 0x3e != 0) |
                                 pGVar10->n_vertices << 2);
  this->str1 = piVar8;
  piVar8 = (int *)operator_new__(-(ulong)((ulong)pGVar10->n_vertices >> 0x3e != 0) |
                                 pGVar10->n_vertices << 2);
  this->first_in = piVar8;
  piVar8 = (int *)operator_new__(-(ulong)((ulong)pGVar10->n_vertices >> 0x3e != 0) |
                                 pGVar10->n_vertices << 2);
  this->next_in = piVar8;
  for (uVar6 = bitset::find_first(this_00); uVar6 != 0xffffffffffffffff;
      uVar6 = bitset::find_next(this_00,uVar6)) {
    pGVar10 = (this->super_Solver).game;
    uVar16 = (ulong)(int)uVar6;
    uVar12 = 1L << (uVar6 & 0x3f);
    puVar1 = (&this->V0)[((pGVar10->_owner)._bits[uVar16 >> 6] >> (uVar6 & 0x3f) & 1) != 0]._bits +
             (uVar6 >> 6);
    *puVar1 = *puVar1 | uVar12;
    iVar14 = pGVar10->_outedges[pGVar10->_firstouts[uVar16]];
    if (iVar14 == -1) {
LAB_001674c9:
      this_03 = (Error *)__cxa_allocate_exception(0x40);
      Error::Error(this_03,"logic error",
                   "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]oink/src/solvers/ssi.cpp"
                   ,0x19a);
      __cxa_throw(this_03,&Error::typeinfo,Error::~Error);
    }
    piVar8 = pGVar10->_outedges + (long)pGVar10->_firstouts[uVar16] + 1;
    while ((this_00->_bits[(ulong)(long)iVar14 >> 6] >> ((long)iVar14 & 0x3fU) & 1) == 0) {
      iVar14 = *piVar8;
      piVar8 = piVar8 + 1;
      if (iVar14 == -1) goto LAB_001674c9;
    }
    if (1 < (this->super_Solver).trace) {
      poVar9 = (this->super_Solver).logger;
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"initial strategy: ",0x12);
      local_40.g = (this->super_Solver).game;
      local_40.v = (int)uVar6;
      poVar9 = operator<<(poVar9,&local_40);
      std::__ostream_insert<char,std::char_traits<char>>(poVar9," => ",4);
      local_50.g = (this->super_Solver).game;
      local_50.v = iVar14;
      poVar9 = operator<<(poVar9,&local_50);
      std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
      pGVar10 = (this->super_Solver).game;
    }
    this->str0[uVar6] = iVar14;
    this->str1[uVar6] = iVar14;
    puVar1 = (&this->halt0)[(*(byte *)(pGVar10->_priority + uVar16) & 1) == 0]._bits + (uVar6 >> 6);
    *puVar1 = *puVar1 | uVar12;
  }
  sVar11 = bitset::count(this_00);
  iVar14 = 0;
  iVar17 = 0;
  do {
    while( true ) {
      iVar17 = iVar17 + 1;
      if ((this->super_Solver).trace != 0) {
        poVar9 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,"\x1b[1;38;5;208mMajor iteration ",0x1d);
        poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar17);
        std::__ostream_insert<char,std::char_traits<char>>(poVar9,"\x1b[m",3);
        std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
        if ((this->super_Solver).trace != 0) {
          poVar9 = (this->super_Solver).logger;
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar9,"Computing Odd\'s best response...",0x20);
          std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
          std::ostream::put((char)poVar9);
          std::ostream::flush();
        }
      }
      do {
        iVar14 = iVar14 + 1;
        compute_vals_ll(this,0);
        iVar4 = switch_opp_strategy(this,0);
      } while (iVar4 != 0);
      iVar4 = mark_solved(this,0);
      if (iVar4 == 0) break;
LAB_001671cf:
      sVar11 = sVar11 - (long)iVar4;
      if (sVar11 == 0) goto LAB_001671da;
    }
    if ((this->super_Solver).trace != 0) {
      poVar9 = (this->super_Solver).logger;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,"Computing Even\'s best response...",0x21);
      std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
    }
    do {
      iVar14 = iVar14 + 1;
      compute_vals_ll(this,1);
      iVar4 = switch_opp_strategy(this,1);
    } while (iVar4 != 0);
    iVar4 = mark_solved(this,1);
    if (iVar4 != 0) goto LAB_001671cf;
    if ((this->super_Solver).trace != 0) {
      poVar9 = (this->super_Solver).logger;
      std::__ostream_insert<char,std::char_traits<char>>(poVar9,"Improving Odd\'s strategy...",0x1b)
      ;
      std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
    }
    iVar5 = switch_sym_strategy(this,1);
    iVar4 = (this->super_Solver).trace;
    if (iVar5 == 0) {
      if (iVar4 != 0) {
        poVar9 = (this->super_Solver).logger;
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar9,"No (possible) improvements - Even wins remainder.",0x31);
        std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
        std::ostream::put((char)poVar9);
        std::ostream::flush();
      }
      sVar11 = (this->W0)._bitssize;
      if (sVar11 != 0) {
        puVar2 = this_00->_bits;
        sVar15 = 0;
        puVar3 = this_01->_bits;
        do {
          puVar3[sVar15] = puVar3[sVar15] | puVar2[sVar15];
          sVar15 = sVar15 + 1;
        } while (sVar11 != sVar15);
      }
      for (sVar11 = bitset::find_first(this_00); sVar11 != 0xffffffffffffffff;
          sVar11 = bitset::find_next(this_00,sVar11)) {
        this->str0[sVar11] = this->str1[sVar11];
      }
      goto LAB_001671da;
    }
    if (iVar4 != 0) {
      poVar9 = (this->super_Solver).logger;
      std::__ostream_insert<char,std::char_traits<char>>
                (poVar9,"Improving Even\'s strategy...",0x1c);
      std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
      std::ostream::put((char)poVar9);
      std::ostream::flush();
    }
    compute_vals_ll(this,0);
    iVar4 = switch_sym_strategy(this,0);
  } while (iVar4 != 0);
  if ((this->super_Solver).trace != 0) {
    poVar9 = (this->super_Solver).logger;
    std::__ostream_insert<char,std::char_traits<char>>
              (poVar9,"No (possible) improvements - Odd wins remainder.",0x30);
    std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
    std::ostream::put((char)poVar9);
    std::ostream::flush();
  }
  sVar11 = (this->W1)._bitssize;
  if (sVar11 != 0) {
    puVar2 = this_00->_bits;
    sVar15 = 0;
    puVar3 = this_02->_bits;
    do {
      puVar3[sVar15] = puVar3[sVar15] | puVar2[sVar15];
      sVar15 = sVar15 + 1;
    } while (sVar11 != sVar15);
  }
  for (sVar11 = bitset::find_first(this_00); sVar11 != 0xffffffffffffffff;
      sVar11 = bitset::find_next(this_00,sVar11)) {
    this->str1[sVar11] = this->str0[sVar11];
  }
LAB_001671da:
  for (uVar6 = bitset::find_first(this_01); uVar6 != 0xffffffffffffffff;
      uVar6 = bitset::find_next(this_01,uVar6)) {
    iVar4 = -1;
    if (((((this->super_Solver).game)->_owner)._bits[(ulong)(long)(int)uVar6 >> 6] >> (uVar6 & 0x3f)
        & 1) == 0) {
      iVar4 = this->str0[uVar6];
    }
    Oink::solve((this->super_Solver).oink,(int)uVar6,0,iVar4);
  }
  for (uVar6 = bitset::find_first(this_02); uVar6 != 0xffffffffffffffff;
      uVar6 = bitset::find_next(this_02,uVar6)) {
    if (((((this->super_Solver).game)->_owner)._bits[(ulong)(long)(int)uVar6 >> 6] >> (uVar6 & 0x3f)
        & 1) == 0) {
      iVar4 = -1;
    }
    else {
      iVar4 = this->str1[uVar6];
    }
    Oink::solve((this->super_Solver).oink,(int)uVar6,1,iVar4);
  }
  if (this->val != (int *)0x0) {
    operator_delete__(this->val);
  }
  if (this->first_in != (int *)0x0) {
    operator_delete__(this->first_in);
  }
  if (this->next_in != (int *)0x0) {
    operator_delete__(this->next_in);
  }
  if (this->str0 != (int *)0x0) {
    operator_delete__(this->str0);
  }
  if (this->str1 != (int *)0x0) {
    operator_delete__(this->str1);
  }
  poVar9 = (this->super_Solver).logger;
  std::__ostream_insert<char,std::char_traits<char>>(poVar9,"solved with ",0xc);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar17);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," major iterations, ",0x13);
  poVar9 = (ostream *)std::ostream::operator<<(poVar9,iVar14);
  std::__ostream_insert<char,std::char_traits<char>>(poVar9," minor iterations.",0x12);
  std::ios::widen((char)poVar9->_vptr_basic_ostream[-3] + (char)poVar9);
  std::ostream::put((char)poVar9);
  std::ostream::flush();
  return;
}

Assistant:

void
SSISolver::run()
{
    // set G to the game
    G = disabled;
    G.flip();
    if (G.none()) return; // nothing to do

    // assume the game is ordered
    k = 1 + priority(G.find_last());

    Q.resize(nodecount());
    C.resize(nodecount());
    V.resize(nodecount());
    W0.resize(nodecount());
    W1.resize(nodecount());
    halt0.resize(nodecount());
    halt1.resize(nodecount());
    V0.resize(nodecount());
    V1.resize(nodecount());

    val = new int[k*nodecount()];
    str0 = new int[nodecount()];
    str1 = new int[nodecount()];

    first_in = new int[nodecount()];
    next_in = new int[nodecount()];

    // initialize the datastructure
    for (auto v = G.find_first(); v != bitset::npos; v = G.find_next(v)) {
        // set V0 or V1
        (owner(v) == 0 ? V0 : V1)[v] = true;
        // select first available edge
        int to = -1;
        for (auto curedge = outs(v); *curedge != -1; curedge++) {
            int u = *curedge;
            if (G[u]) {
                to = u;
                break;
            }
        }
        if (to == -1) LOGIC_ERROR;
#ifndef NDEBUG
        if (trace >= 2) {
            logger << "initial strategy: " << label_vertex(v) << " => " << label_vertex(to) << std::endl;
        }
#endif
        // set initial strategy of <v> to <to>.
        str0[v] = to;
        str1[v] = to;
        // halt for the right player
        if (priority(v)&1) {
            // odd priority, so halt for even
            halt0[v] = true;
        } else {
            // even priority, so halt for odd
            halt1[v] = true;
        }
    }

    int minor = 0, major = 0;
    auto remaining = G.count();

    for (;;) {
        ++major;
        if (trace) {
            logger << "\033[1;38;5;208mMajor iteration " << major << "\033[m" << std::endl;
        }
        {
            // First compute Odd's best response for Even's strategy
            if (trace) logger << "Computing Odd's best response..." << std::endl;
            for (;;) {
                ++minor;
                compute_vals_ll(0);
                int count = switch_opp_strategy(0);
                if (count == 0) break; // if nothing left, done
            }
            int solved = mark_solved(0); // mark nodes won by Even after Odd's best response
            if (solved != 0) {
                remaining -= solved;
                if (remaining <= 0) break;
                continue; // restart major loop
            }
        }
        {
            // Now compute Even's best response for Odd's strategy
            if (trace) logger << "Computing Even's best response..." << std::endl;
            for (;;) {
                ++minor;
                compute_vals_ll(1);
                int count = switch_opp_strategy(1);
                if (count == 0) break; // if nothing left, done
            }
            int solved = mark_solved(1); // mark nodes won by Odd after Even's best response
            if (solved != 0) {
                remaining -= solved;
                if (remaining <= 0) break;
                continue; // restart major loop
            }
        }
        if (trace) logger << "Improving Odd's strategy..." << std::endl;
        if (switch_sym_strategy(1) == 0) {
            // Now all vertices not in a winning region are won by Even with strategy str1
            if (trace) logger << "No (possible) improvements - Even wins remainder." << std::endl;
            W0 |= G;
            for (auto v = G.find_first(); v != bitset::npos; v = G.find_next(v)) {
                str0[v] = str1[v];
            }
            break;
        }
        if (trace) logger << "Improving Even's strategy..." << std::endl;
        compute_vals_ll(0);
        if (switch_sym_strategy(0) == 0) {
            // Now all vertices not in a winning region are won by Odd with strategy str0
            if (trace) logger << "No (possible) improvements - Odd wins remainder." << std::endl;
            W1 |= G;
            for (auto v = G.find_first(); v != bitset::npos; v = G.find_next(v)) {
                str1[v] = str0[v];
            }
            break;
        }
    }

    for (auto v = W0.find_first(); v != bitset::npos; v = W0.find_next(v)) {
        Solver::solve(v, 0, owner(v) == 0 ? str0[v] : -1);
    }

    for (auto v = W1.find_first(); v != bitset::npos; v = W1.find_next(v)) {
        Solver::solve(v, 1, owner(v) == 1 ? str1[v] : -1);
    }

    delete[] val;
    delete[] first_in;
    delete[] next_in;
    delete[] str0;
    delete[] str1;

    logger << "solved with " << major << " major iterations, " << minor << " minor iterations." << std::endl;
}